

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceIntersectorK<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  undefined4 uVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t sVar10;
  NodeRef *pNVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  Primitive *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar15;
  float fVar16;
  float fVar17;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar18;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vint4 ai_2;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 ai;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 ai_1;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar44;
  float fVar45;
  vint4 ai_3;
  undefined1 auVar42 [16];
  float fVar46;
  undefined1 auVar43 [16];
  vint4 bi;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 bi_1;
  undefined1 auVar49 [16];
  vint4 bi_3;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi_2;
  undefined1 auVar52 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid0;
  InstanceIntersectorK<4> local_16e8 [16];
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar35 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
    auVar53 = ZEXT1664(auVar35);
    auVar8 = vpcmpeqd_avx(auVar35,(undefined1  [16])valid_i->field_0);
    auVar28 = ZEXT816(0) << 0x40;
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar28,5);
    auVar9 = auVar8 & auVar7;
    if ((((auVar9 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar9 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar9[0xf] < '\0') {
      auVar4 = vandps_avx(auVar7,auVar8);
      auVar7 = *(undefined1 (*) [16])ray;
      auVar8 = *(undefined1 (*) [16])(ray + 0x10);
      auVar9 = *(undefined1 (*) [16])(ray + 0x20);
      auVar38._8_4_ = 0x7fffffff;
      auVar38._0_8_ = 0x7fffffff7fffffff;
      auVar38._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar38);
      auVar47._8_4_ = 0x219392ef;
      auVar47._0_8_ = 0x219392ef219392ef;
      auVar47._12_4_ = 0x219392ef;
      auVar20 = vcmpps_avx(auVar20,auVar47,1);
      auVar21 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar47,auVar20);
      auVar20 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar38);
      auVar20 = vcmpps_avx(auVar20,auVar47,1);
      auVar29 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar47,auVar20);
      auVar20 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar38);
      auVar20 = vcmpps_avx(auVar20,auVar47,1);
      auVar20 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar47,auVar20);
      auVar38 = vrcpps_avx(auVar21);
      fVar16 = auVar38._0_4_;
      auVar36._0_4_ = auVar21._0_4_ * fVar16;
      fVar22 = auVar38._4_4_;
      auVar36._4_4_ = auVar21._4_4_ * fVar22;
      fVar24 = auVar38._8_4_;
      auVar36._8_4_ = auVar21._8_4_ * fVar24;
      fVar26 = auVar38._12_4_;
      auVar36._12_4_ = auVar21._12_4_ * fVar26;
      auVar50._8_4_ = 0x3f800000;
      auVar50._0_8_ = 0x3f8000003f800000;
      auVar50._12_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar50,auVar36);
      auVar21 = vrcpps_avx(auVar29);
      fVar41 = auVar21._0_4_;
      auVar42._0_4_ = fVar41 * auVar29._0_4_;
      fVar44 = auVar21._4_4_;
      auVar42._4_4_ = fVar44 * auVar29._4_4_;
      fVar45 = auVar21._8_4_;
      auVar42._8_4_ = fVar45 * auVar29._8_4_;
      fVar46 = auVar21._12_4_;
      auVar42._12_4_ = fVar46 * auVar29._12_4_;
      auVar29 = vsubps_avx(auVar50,auVar42);
      auVar21 = vrcpps_avx(auVar20);
      fVar17 = auVar21._0_4_;
      auVar39._0_4_ = fVar17 * auVar20._0_4_;
      fVar23 = auVar21._4_4_;
      auVar39._4_4_ = fVar23 * auVar20._4_4_;
      fVar25 = auVar21._8_4_;
      auVar39._8_4_ = fVar25 * auVar20._8_4_;
      fVar27 = auVar21._12_4_;
      auVar39._12_4_ = fVar27 * auVar20._12_4_;
      auVar21 = vsubps_avx(auVar50,auVar39);
      auVar20 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar28);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      aVar5.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar20,auVar4);
      auVar54 = ZEXT1664(CONCAT412(auVar4._12_4_ ^ auVar35._12_4_,
                                   CONCAT48(auVar4._8_4_ ^ auVar35._8_4_,
                                            CONCAT44(auVar4._4_4_ ^ auVar35._4_4_,
                                                     auVar4._0_4_ ^ auVar35._0_4_))));
      fVar41 = fVar41 + fVar41 * auVar29._0_4_;
      fVar44 = fVar44 + fVar44 * auVar29._4_4_;
      fVar45 = fVar45 + fVar45 * auVar29._8_4_;
      fVar46 = fVar46 + fVar46 * auVar29._12_4_;
      auVar35 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar28);
      auVar28._8_4_ = 0xff800000;
      auVar28._0_8_ = 0xff800000ff800000;
      auVar28._12_4_ = 0xff800000;
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar28,auVar35,auVar4);
      fVar16 = fVar16 + fVar16 * auVar38._0_4_;
      fVar22 = fVar22 + fVar22 * auVar38._4_4_;
      fVar24 = fVar24 + fVar24 * auVar38._8_4_;
      fVar26 = fVar26 + fVar26 * auVar38._12_4_;
      fVar17 = fVar17 + fVar17 * auVar21._0_4_;
      fVar23 = fVar23 + fVar23 * auVar21._4_4_;
      fVar25 = fVar25 + fVar25 * auVar21._8_4_;
      fVar27 = fVar27 + fVar27 * auVar21._12_4_;
      auVar52 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      pNVar11 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar15 = &stack_near[2].field_0;
      stack_near[1].field_0 = aVar5;
LAB_00ed04e7:
      auVar35 = auVar54._0_16_;
      pNVar1 = pNVar11 + -1;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        pNVar11 = pNVar11 + -1;
        aVar18 = paVar15[-1];
        paVar15 = paVar15 + -1;
        auVar28 = vcmpps_avx((undefined1  [16])aVar18,(undefined1  [16])bi_8.field_0,1);
        sVar14 = pNVar1->ptr;
        if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar28[0xf] < '\0') {
          do {
            if ((sVar14 & 8) != 0) {
              if (sVar14 == 0xfffffffffffffff8) goto LAB_00ed0743;
              auVar28 = vcmpps_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])aVar18,6);
              if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar28[0xf] < '\0') {
                aVar19._0_4_ = auVar54._0_4_ ^ auVar53._0_4_;
                aVar19._4_4_ = auVar54._4_4_ ^ auVar53._4_4_;
                aVar19._8_4_ = auVar54._8_4_ ^ auVar53._8_4_;
                aVar19._12_4_ = auVar54._12_4_ ^ auVar53._12_4_;
                lVar13 = (ulong)((uint)sVar14 & 0xf) - 7;
                prim = (Primitive *)(sVar14 & 0xfffffffffffffff0);
                goto LAB_00ed0692;
              }
              break;
            }
            sVar12 = 8;
            aVar18 = auVar52._0_16_;
            for (lVar13 = 0;
                (lVar13 != 4 &&
                (sVar3 = *(size_t *)((sVar14 & 0xfffffffffffffff0) + lVar13 * 8), sVar3 != 8));
                lVar13 = lVar13 + 1) {
              uVar2 = *(undefined4 *)(sVar14 + 0x20 + lVar13 * 4);
              auVar29._4_4_ = uVar2;
              auVar29._0_4_ = uVar2;
              auVar29._8_4_ = uVar2;
              auVar29._12_4_ = uVar2;
              auVar28 = vsubps_avx(auVar29,auVar7);
              auVar37._0_4_ = fVar16 * auVar28._0_4_;
              auVar37._4_4_ = fVar22 * auVar28._4_4_;
              auVar37._8_4_ = fVar24 * auVar28._8_4_;
              auVar37._12_4_ = fVar26 * auVar28._12_4_;
              uVar2 = *(undefined4 *)(sVar14 + 0x40 + lVar13 * 4);
              auVar30._4_4_ = uVar2;
              auVar30._0_4_ = uVar2;
              auVar30._8_4_ = uVar2;
              auVar30._12_4_ = uVar2;
              auVar28 = vsubps_avx(auVar30,auVar8);
              auVar40._0_4_ = fVar41 * auVar28._0_4_;
              auVar40._4_4_ = fVar44 * auVar28._4_4_;
              auVar40._8_4_ = fVar45 * auVar28._8_4_;
              auVar40._12_4_ = fVar46 * auVar28._12_4_;
              uVar2 = *(undefined4 *)(sVar14 + 0x60 + lVar13 * 4);
              auVar31._4_4_ = uVar2;
              auVar31._0_4_ = uVar2;
              auVar31._8_4_ = uVar2;
              auVar31._12_4_ = uVar2;
              auVar28 = vsubps_avx(auVar31,auVar9);
              auVar43._0_4_ = fVar17 * auVar28._0_4_;
              auVar43._4_4_ = fVar23 * auVar28._4_4_;
              auVar43._8_4_ = fVar25 * auVar28._8_4_;
              auVar43._12_4_ = fVar27 * auVar28._12_4_;
              uVar2 = *(undefined4 *)(sVar14 + 0x30 + lVar13 * 4);
              auVar32._4_4_ = uVar2;
              auVar32._0_4_ = uVar2;
              auVar32._8_4_ = uVar2;
              auVar32._12_4_ = uVar2;
              auVar28 = vsubps_avx(auVar32,auVar7);
              auVar48._0_4_ = fVar16 * auVar28._0_4_;
              auVar48._4_4_ = fVar22 * auVar28._4_4_;
              auVar48._8_4_ = fVar24 * auVar28._8_4_;
              auVar48._12_4_ = fVar26 * auVar28._12_4_;
              uVar2 = *(undefined4 *)(sVar14 + 0x50 + lVar13 * 4);
              auVar33._4_4_ = uVar2;
              auVar33._0_4_ = uVar2;
              auVar33._8_4_ = uVar2;
              auVar33._12_4_ = uVar2;
              auVar28 = vsubps_avx(auVar33,auVar8);
              auVar49._0_4_ = fVar41 * auVar28._0_4_;
              auVar49._4_4_ = fVar44 * auVar28._4_4_;
              auVar49._8_4_ = fVar45 * auVar28._8_4_;
              auVar49._12_4_ = fVar46 * auVar28._12_4_;
              uVar2 = *(undefined4 *)(sVar14 + 0x70 + lVar13 * 4);
              auVar34._4_4_ = uVar2;
              auVar34._0_4_ = uVar2;
              auVar34._8_4_ = uVar2;
              auVar34._12_4_ = uVar2;
              auVar28 = vsubps_avx(auVar34,auVar9);
              auVar51._0_4_ = fVar17 * auVar28._0_4_;
              auVar51._4_4_ = fVar23 * auVar28._4_4_;
              auVar51._8_4_ = fVar25 * auVar28._8_4_;
              auVar51._12_4_ = fVar27 * auVar28._12_4_;
              auVar28 = vpminsd_avx(auVar37,auVar48);
              auVar20 = vpminsd_avx(auVar40,auVar49);
              auVar28 = vpmaxsd_avx(auVar28,auVar20);
              auVar20 = vpminsd_avx(auVar43,auVar51);
              auVar20 = vpmaxsd_avx(auVar28,auVar20);
              auVar28 = vpmaxsd_avx(auVar37,auVar48);
              auVar21 = vpmaxsd_avx(auVar40,auVar49);
              auVar29 = vpminsd_avx(auVar28,auVar21);
              auVar28 = vpmaxsd_avx(auVar43,auVar51);
              auVar21 = vpmaxsd_avx(auVar20,(undefined1  [16])aVar5);
              auVar28 = vpminsd_avx(auVar28,(undefined1  [16])bi_8.field_0);
              auVar28 = vpminsd_avx(auVar29,auVar28);
              auVar28 = vcmpps_avx(auVar21,auVar28,2);
              sVar10 = sVar12;
              aVar6 = aVar18;
              if (((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar28[0xf] < '\0') &&
                 (aVar6.v = (__m128)vblendvps_avx(auVar52._0_16_,auVar20,auVar28), sVar10 = sVar3,
                 sVar12 != 8)) {
                pNVar11->ptr = sVar12;
                pNVar11 = pNVar11 + 1;
                *paVar15 = aVar18;
                paVar15 = paVar15 + 1;
              }
              aVar18 = aVar6;
              sVar12 = sVar10;
            }
            sVar14 = sVar12;
          } while (sVar12 != 8);
        }
        goto LAB_00ed04e7;
      }
LAB_00ed0743:
      auVar7 = vandps_avx(auVar35,auVar4);
      auVar35._8_4_ = 0xff800000;
      auVar35._0_8_ = 0xff800000ff800000;
      auVar35._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar35);
      *(undefined1 (*) [16])(ray + 0x80) = auVar7;
    }
  }
  return;
  while( true ) {
    valid0.field_0 = aVar19;
    InstanceIntersectorK<4>::occluded(local_16e8,&valid0,&pre,ray,context,prim);
    auVar28 = auVar53._0_16_;
    aVar19.v = (__m128)vandnps_avx((undefined1  [16])local_16e8,valid0.field_0);
    auVar20 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_16e8;
    prim = prim + 1;
    if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar20 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar20 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar20[0xf])
    break;
LAB_00ed0692:
    auVar28 = auVar53._0_16_;
    lVar13 = lVar13 + -1;
    if (lVar13 == 0) break;
  }
  auVar28 = vpcmpeqd_avx(auVar28,auVar28);
  auVar53 = ZEXT1664(auVar28);
  auVar20._0_4_ = auVar28._0_4_ ^ aVar19.i[0];
  auVar20._4_4_ = auVar28._4_4_ ^ aVar19.i[1];
  auVar20._8_4_ = auVar28._8_4_ ^ aVar19.i[2];
  auVar20._12_4_ = auVar28._12_4_ ^ aVar19.i[3];
  auVar35 = vorps_avx(auVar35,auVar20);
  auVar54 = ZEXT1664(auVar35);
  auVar28 = auVar28 & ~auVar35;
  if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar28[0xf])
  goto LAB_00ed0743;
  auVar21._8_4_ = 0xff800000;
  auVar21._0_8_ = 0xff800000ff800000;
  auVar21._12_4_ = 0xff800000;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx((undefined1  [16])bi_8.field_0,auVar21,auVar35);
  auVar52 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  goto LAB_00ed04e7;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }